

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPLoader.cpp
# Opt level: O2

void __thiscall Assimp::HMPImporter::InternReadFile_HMP7(HMPImporter *this)

{
  int iVar1;
  uchar *puVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  aiMesh **ppaVar5;
  aiMesh *this_00;
  ulong uVar6;
  aiVector3D *paVar7;
  ulong uVar8;
  aiNode *this_01;
  uint *puVar9;
  uchar *szPos;
  aiVector3D *this_02;
  ushort *puVar10;
  uint uVar11;
  uint local_58;
  uchar *szCurrent;
  
  puVar2 = (this->super_MDLImporter).mBuffer;
  szCurrent = puVar2 + 0x54;
  ValidateHeader_HMP457(this);
  ((this->super_MDLImporter).pScene)->mNumMeshes = 1;
  ppaVar5 = (aiMesh **)operator_new__(8);
  ((this->super_MDLImporter).pScene)->mMeshes = ppaVar5;
  this_00 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(this_00);
  *((this->super_MDLImporter).pScene)->mMeshes = this_00;
  this_00->mMaterialIndex = 0;
  iVar1 = *(int *)(puVar2 + 0x3c);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)iVar1;
  uVar6 = SUB168(auVar3 * ZEXT816(0xc),0);
  uVar8 = 0xffffffffffffffff;
  if (SUB168(auVar3 * ZEXT816(0xc),8) == 0) {
    uVar8 = uVar6;
  }
  paVar7 = (aiVector3D *)operator_new__(uVar8);
  if (iVar1 != 0) {
    memset(paVar7,0,((uVar6 - 0xc) - (uVar6 - 0xc) % 0xc) + 0xc);
  }
  this_00->mVertices = paVar7;
  paVar7 = (aiVector3D *)operator_new__(uVar8);
  if (iVar1 != 0) {
    memset(paVar7,0,((uVar6 - 0xc) - (uVar6 - 0xc) % 0xc) + 0xc);
  }
  this_00->mNormals = paVar7;
  uVar6 = (ulong)((float)iVar1 / *(float *)(puVar2 + 0x2c));
  uVar8 = (ulong)*(float *)(puVar2 + 0x2c);
  CreateMaterial(this,puVar2 + 0x54,&szCurrent);
  puVar10 = (ushort *)(szCurrent + 0x24);
  local_58 = (uint)uVar8;
  szPos = szCurrent + (uVar6 & 0xffffffff) * (uVar8 & 0xffffffff) * 4 + 0x24;
  szCurrent = (uchar *)puVar10;
  MDLImporter::SizeCheck(&this->super_MDLImporter,szPos);
  paVar7 = this_00->mVertices;
  this_02 = this_00->mNormals;
  for (uVar4 = 0; uVar11 = (uint)uVar6, uVar4 != uVar11; uVar4 = uVar4 + 1) {
    for (uVar11 = 0; local_58 != uVar11; uVar11 = uVar11 + 1) {
      paVar7->x = (float)uVar11 * *(float *)(puVar2 + 0x24);
      paVar7->y = *(float *)(puVar2 + 0x28) * (float)uVar4;
      paVar7->z = ((float)*puVar10 / 65535.0 + -0.5) * *(float *)(puVar2 + 0x24) * 8.0;
      this_02->x = (float)(int)(char)puVar10[1] * 0.0078125;
      this_02->y = (float)(int)*(char *)((long)puVar10 + 3) * 0.0078125;
      this_02->z = 1.0;
      aiVector3t<float>::Normalize(this_02);
      paVar7 = paVar7 + 1;
      this_02 = this_02 + 1;
      puVar10 = puVar10 + 2;
    }
  }
  if (*(int *)(puVar2 + 0x30) != 0) {
    GenerateTextureCoords(this,local_58,uVar11);
  }
  CreateOutputFaceList(this,local_58,uVar11);
  this_01 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_01);
  ((this->super_MDLImporter).pScene)->mRootNode = this_01;
  aiString::Set(&((this->super_MDLImporter).pScene)->mRootNode->mName,"terrain_root");
  ((this->super_MDLImporter).pScene)->mRootNode->mNumMeshes = 1;
  puVar9 = (uint *)operator_new__(4);
  ((this->super_MDLImporter).pScene)->mRootNode->mMeshes = puVar9;
  *((this->super_MDLImporter).pScene)->mRootNode->mMeshes = 0;
  return;
}

Assistant:

void HMPImporter::InternReadFile_HMP7( )
{
    // read the file header and skip everything to byte 84
    const HMP::Header_HMP5* const pcHeader = (const HMP::Header_HMP5*)mBuffer;
    const unsigned char* szCurrent = (const unsigned char*)(mBuffer+84);
    ValidateHeader_HMP457();

    // generate an output mesh
    pScene->mNumMeshes = 1;
    pScene->mMeshes = new aiMesh*[1];
    aiMesh* pcMesh = pScene->mMeshes[0] = new aiMesh();

    pcMesh->mMaterialIndex = 0;
    pcMesh->mVertices = new aiVector3D[pcHeader->numverts];
    pcMesh->mNormals = new aiVector3D[pcHeader->numverts];

    const unsigned int height = (unsigned int)(pcHeader->numverts / pcHeader->fnumverts_x);
    const unsigned int width = (unsigned int)pcHeader->fnumverts_x;

    // generate/load a material for the terrain
    CreateMaterial(szCurrent,&szCurrent);

    // goto offset 120, I don't know why ...
    // (fixme) is this the frame header? I assume yes since it starts with 2.
    szCurrent += 36;

    SizeCheck(szCurrent + sizeof(const HMP::Vertex_HMP7)*height*width);

    // now load all vertices from the file
    aiVector3D* pcVertOut = pcMesh->mVertices;
    aiVector3D* pcNorOut = pcMesh->mNormals;
    const HMP::Vertex_HMP7* src = (const HMP::Vertex_HMP7*) szCurrent;
    for (unsigned int y = 0; y < height;++y)
    {
        for (unsigned int x = 0; x < width;++x)
        {
            pcVertOut->x = x * pcHeader->ftrisize_x;
            pcVertOut->y = y * pcHeader->ftrisize_y;

            // FIXME: What exctly is the correct scaling factor to use?
            // possibly pcHeader->scale_origin[2] in combination with a
            // signed interpretation of src->z?
            pcVertOut->z = (((float)src->z / 0xffff)-0.5f) * pcHeader->ftrisize_x * 8.0f;

            pcNorOut->x = ((float)src->normal_x / 0x80 ); // * pcHeader->scale_origin[0];
            pcNorOut->y = ((float)src->normal_y / 0x80 ); // * pcHeader->scale_origin[1];
            pcNorOut->z = 1.0f;
            pcNorOut->Normalize();

            ++pcVertOut;++pcNorOut;++src;
        }
    }

    // generate texture coordinates if necessary
    if (pcHeader->numskins)GenerateTextureCoords(width,height);

    // now build a list of faces
    CreateOutputFaceList(width,height);

    // there is no nodegraph in HMP files. Simply assign the one mesh
    // (no, not the One Ring) to the root node
    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mName.Set("terrain_root");
    pScene->mRootNode->mNumMeshes = 1;
    pScene->mRootNode->mMeshes = new unsigned int[1];
    pScene->mRootNode->mMeshes[0] = 0;
}